

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O1

void iCopyColors<cCMYK,cBGRA,bSubtract>
               (BYTE *pout,BYTE *pin,int count,int step,FCopyInfo *inf,BYTE tr,BYTE tg,BYTE tb)

{
  byte bVar1;
  FSpecialColormap *pFVar2;
  EBlend EVar3;
  long lVar4;
  BYTE BVar5;
  int iVar6;
  int iVar7;
  byte *pbVar8;
  long lVar9;
  byte bVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  BYTE BVar15;
  int iVar16;
  byte bVar17;
  
  pFVar2 = SpecialColormaps.Array;
  if (inf == (FCopyInfo *)0x0) {
    EVar3 = BLEND_NONE;
  }
  else {
    EVar3 = inf->blend;
  }
  switch(EVar3) {
  case BLEND_NONE:
    if (0 < count) {
      pbVar8 = pin + 3;
      lVar4 = 0;
      do {
        iVar6 = (uint)pout[lVar4 * 4 + 2] * 0x10000 -
                (uint)(byte)(*pbVar8 - (char)((0x100 - (uint)pbVar8[-3]) * (uint)*pbVar8 >> 8)) *
                inf->alpha;
        if (iVar6 >> 0x10 < 1) {
          iVar6 = 0;
        }
        pout[lVar4 * 4 + 2] = (BYTE)((uint)iVar6 >> 0x10);
        iVar6 = (uint)pout[lVar4 * 4 + 1] * 0x10000 -
                (uint)(byte)(*pbVar8 - (char)((0x100 - (uint)pbVar8[-2]) * (uint)*pbVar8 >> 8)) *
                inf->alpha;
        if (iVar6 >> 0x10 < 1) {
          iVar6 = 0;
        }
        pout[lVar4 * 4 + 1] = (BYTE)((uint)iVar6 >> 0x10);
        iVar6 = (uint)pout[lVar4 * 4] * 0x10000 -
                (uint)(byte)(*pbVar8 - (char)((0x100 - (uint)pbVar8[-1]) * (uint)*pbVar8 >> 8)) *
                inf->alpha;
        if (iVar6 >> 0x10 < 1) {
          iVar6 = 0;
        }
        pout[lVar4 * 4] = (BYTE)((uint)iVar6 >> 0x10);
        pout[lVar4 * 4 + 3] = 0xff;
        lVar4 = lVar4 + 1;
        pbVar8 = pbVar8 + step;
      } while (count != (int)lVar4);
    }
    break;
  case BLEND_ICEMAP:
    if (0 < count) {
      pbVar8 = pin + 3;
      lVar4 = 0;
      do {
        bVar17 = *pbVar8;
        bVar10 = bVar17 - (char)((0x100 - (uint)pbVar8[-1]) * (uint)bVar17 >> 8);
        uVar11 = (uint)(byte)(bVar17 - (char)((0x100 - (uint)pbVar8[-2]) * (uint)bVar17 >> 8)) *
                 0x8f + (uint)(byte)(bVar17 - (char)((0x100 - (uint)pbVar8[-3]) * (uint)bVar17 >> 8)
                                    ) * 0x4d + ((uint)bVar10 + (uint)bVar10 * 8) * 4 >> 0xc;
        iVar6 = (uint)pout[lVar4 * 4 + 2] * 0x10000 - (uint)IcePalette[uVar11][0] * inf->alpha;
        BVar15 = (BYTE)((uint)iVar6 >> 0x10);
        if (iVar6 >> 0x10 < 1) {
          BVar15 = '\0';
        }
        pout[lVar4 * 4 + 2] = BVar15;
        iVar6 = (uint)pout[lVar4 * 4 + 1] * 0x10000 - (uint)IcePalette[uVar11][1] * inf->alpha;
        BVar15 = (BYTE)((uint)iVar6 >> 0x10);
        if (iVar6 >> 0x10 < 1) {
          BVar15 = '\0';
        }
        pout[lVar4 * 4 + 1] = BVar15;
        iVar6 = (uint)pout[lVar4 * 4] * 0x10000 - (uint)IcePalette[uVar11][2] * inf->alpha;
        BVar15 = (BYTE)((uint)iVar6 >> 0x10);
        if (iVar6 >> 0x10 < 1) {
          BVar15 = '\0';
        }
        pout[lVar4 * 4] = BVar15;
        pout[lVar4 * 4 + 3] = 0xff;
        lVar4 = lVar4 + 1;
        pbVar8 = pbVar8 + step;
      } while (count != (int)lVar4);
    }
    break;
  case BLEND_OVERLAY:
    if (0 < count) {
      pbVar8 = pin + 3;
      lVar4 = 0;
      do {
        bVar17 = *pbVar8;
        iVar6 = inf->blendcolor[3];
        bVar10 = pbVar8[-2];
        iVar16 = inf->blendcolor[1];
        bVar1 = pbVar8[-1];
        iVar7 = inf->blendcolor[2];
        iVar14 = (uint)pout[lVar4 * 4 + 2] * 0x10000 -
                 ((uint)(byte)(bVar17 - (char)((0x100 - (uint)pbVar8[-3]) * (uint)bVar17 >> 8)) *
                  iVar6 + inf->blendcolor[0] >> 0x10 & 0xff) * inf->alpha;
        BVar15 = (BYTE)((uint)iVar14 >> 0x10);
        if (iVar14 >> 0x10 < 1) {
          BVar15 = '\0';
        }
        pout[lVar4 * 4 + 2] = BVar15;
        iVar16 = (uint)pout[lVar4 * 4 + 1] * 0x10000 -
                 ((uint)(byte)(bVar17 - (char)((0x100 - (uint)bVar10) * (uint)bVar17 >> 8)) * iVar6
                  + iVar16 >> 0x10 & 0xff) * inf->alpha;
        BVar15 = (BYTE)((uint)iVar16 >> 0x10);
        if (iVar16 >> 0x10 < 1) {
          BVar15 = '\0';
        }
        pout[lVar4 * 4 + 1] = BVar15;
        iVar6 = (uint)pout[lVar4 * 4] * 0x10000 -
                ((uint)(byte)(bVar17 - (char)((0x100 - (uint)bVar1) * (uint)bVar17 >> 8)) * iVar6 +
                 iVar7 >> 0x10 & 0xff) * inf->alpha;
        BVar15 = (BYTE)((uint)iVar6 >> 0x10);
        if (iVar6 >> 0x10 < 1) {
          BVar15 = '\0';
        }
        pout[lVar4 * 4] = BVar15;
        pout[lVar4 * 4 + 3] = 0xff;
        lVar4 = lVar4 + 1;
        pbVar8 = pbVar8 + step;
      } while (count != (int)lVar4);
    }
    break;
  case BLEND_MODULATE:
    if (0 < count) {
      pbVar8 = pin + 3;
      lVar4 = 0;
      do {
        bVar17 = *pbVar8;
        bVar10 = pbVar8[-2];
        iVar6 = inf->blendcolor[1];
        bVar1 = pbVar8[-1];
        iVar16 = inf->blendcolor[2];
        iVar7 = (uint)pout[lVar4 * 4 + 2] * 0x10000 -
                ((uint)(byte)(bVar17 - (char)((0x100 - (uint)pbVar8[-3]) * (uint)bVar17 >> 8)) *
                 inf->blendcolor[0] >> 0x10 & 0xff) * inf->alpha;
        BVar15 = (BYTE)((uint)iVar7 >> 0x10);
        if (iVar7 >> 0x10 < 1) {
          BVar15 = '\0';
        }
        pout[lVar4 * 4 + 2] = BVar15;
        iVar6 = (uint)pout[lVar4 * 4 + 1] * 0x10000 -
                ((uint)(byte)(bVar17 - (char)((0x100 - (uint)bVar10) * (uint)bVar17 >> 8)) * iVar6
                 >> 0x10 & 0xff) * inf->alpha;
        BVar15 = (BYTE)((uint)iVar6 >> 0x10);
        if (iVar6 >> 0x10 < 1) {
          BVar15 = '\0';
        }
        pout[lVar4 * 4 + 1] = BVar15;
        iVar6 = (uint)pout[lVar4 * 4] * 0x10000 -
                ((uint)(byte)(bVar17 - (char)((0x100 - (uint)bVar1) * (uint)bVar17 >> 8)) * iVar16
                 >> 0x10 & 0xff) * inf->alpha;
        BVar15 = (BYTE)((uint)iVar6 >> 0x10);
        if (iVar6 >> 0x10 < 1) {
          BVar15 = '\0';
        }
        pout[lVar4 * 4] = BVar15;
        pout[lVar4 * 4 + 3] = 0xff;
        lVar4 = lVar4 + 1;
        pbVar8 = pbVar8 + step;
      } while (count != (int)lVar4);
    }
    break;
  default:
    EVar3 = inf->blend;
    lVar4 = (long)EVar3;
    if (lVar4 < 0x21) {
      if ((BLEND_ICEMAP < EVar3) && (0 < count)) {
        iVar6 = 0x20 - EVar3;
        pbVar8 = pin + 3;
        lVar4 = 0;
        do {
          bVar17 = *pbVar8;
          uVar12 = (uint)(byte)(bVar17 - (char)((0x100 - (uint)pbVar8[-3]) * (uint)bVar17 >> 8));
          uVar11 = (uint)(byte)(bVar17 - (char)((0x100 - (uint)pbVar8[-2]) * (uint)bVar17 >> 8));
          bVar17 = bVar17 - (char)((0x100 - (uint)pbVar8[-1]) * (uint)bVar17 >> 8);
          iVar14 = (uVar11 * 0x8f + uVar12 * 0x4d + ((uint)bVar17 + (uint)bVar17 * 8) * 4 >> 8) *
                   (EVar3 + BLEND_MODULATE);
          iVar16 = uVar12 * iVar6 + iVar14;
          iVar7 = uVar11 * iVar6 + iVar14;
          iVar14 = (uint)bVar17 * iVar6 + iVar14;
          iVar16 = (uint)pout[lVar4 * 4 + 2] * 0x10000 -
                   ((uint)((ulong)((long)iVar16 * 0x84210843) >> 0x24) - (iVar16 >> 0x1f) & 0xff) *
                   inf->alpha;
          BVar5 = '\0';
          BVar15 = (BYTE)((uint)iVar16 >> 0x10);
          if (iVar16 >> 0x10 < 1) {
            BVar15 = BVar5;
          }
          pout[lVar4 * 4 + 2] = BVar15;
          iVar16 = (uint)pout[lVar4 * 4 + 1] * 0x10000 -
                   ((uint)((ulong)((long)iVar7 * 0x84210843) >> 0x24) - (iVar7 >> 0x1f) & 0xff) *
                   inf->alpha;
          BVar15 = (BYTE)((uint)iVar16 >> 0x10);
          if (iVar16 >> 0x10 < 1) {
            BVar15 = BVar5;
          }
          pout[lVar4 * 4 + 1] = BVar15;
          iVar16 = (uint)pout[lVar4 * 4] * 0x10000 -
                   ((uint)((ulong)((long)iVar14 * 0x84210843) >> 0x24) - (iVar14 >> 0x1f) & 0xff) *
                   inf->alpha;
          BVar15 = (BYTE)((uint)iVar16 >> 0x10);
          if (iVar16 >> 0x10 < 1) {
            BVar15 = BVar5;
          }
          pout[lVar4 * 4] = BVar15;
          pout[lVar4 * 4 + 3] = 0xff;
          lVar4 = lVar4 + 1;
          pbVar8 = pbVar8 + step;
        } while (count != (int)lVar4);
      }
    }
    else if (0 < count) {
      pbVar8 = pin + 3;
      lVar9 = 0;
      do {
        bVar17 = *pbVar8;
        bVar10 = bVar17 - (char)((0x100 - (uint)pbVar8[-1]) * (uint)bVar17 >> 8);
        uVar11 = (uint)(byte)(bVar17 - (char)((0x100 - (uint)pbVar8[-2]) * (uint)bVar17 >> 8)) *
                 0x8f + (uint)(byte)(bVar17 - (char)((0x100 - (uint)pbVar8[-3]) * (uint)bVar17 >> 8)
                                    ) * 0x4d + ((uint)bVar10 + (uint)bVar10 * 8) * 4;
        uVar12 = uVar11 >> 8;
        if (0xfe < uVar12) {
          uVar12 = 0xff;
        }
        if (uVar11 < 0x100) {
          uVar12 = 0;
        }
        uVar13 = (ulong)uVar12;
        iVar6 = (uint)pout[lVar9 * 4 + 2] * 0x10000 -
                (uint)*(byte *)((long)pFVar2 + uVar13 * 4 + lVar4 * 0x518 + -0xa6fe) * inf->alpha;
        if (iVar6 >> 0x10 < 1) {
          iVar6 = 0;
        }
        bVar17 = *(byte *)((long)pFVar2 + uVar13 * 4 + lVar4 * 0x518 + -0xa700);
        bVar10 = *(byte *)((long)pFVar2 + uVar13 * 4 + lVar4 * 0x518 + -0xa6ff);
        pout[lVar9 * 4 + 2] = (BYTE)((uint)iVar6 >> 0x10);
        iVar6 = (uint)pout[lVar9 * 4 + 1] * 0x10000 - (uint)bVar10 * inf->alpha;
        if (iVar6 >> 0x10 < 1) {
          iVar6 = 0;
        }
        pout[lVar9 * 4 + 1] = (BYTE)((uint)iVar6 >> 0x10);
        iVar6 = (uint)pout[lVar9 * 4] * 0x10000 - (uint)bVar17 * inf->alpha;
        if (iVar6 >> 0x10 < 1) {
          iVar6 = 0;
        }
        pout[lVar9 * 4] = (BYTE)((uint)iVar6 >> 0x10);
        pout[lVar9 * 4 + 3] = 0xff;
        lVar9 = lVar9 + 1;
        pbVar8 = pbVar8 + step;
      } while (count != (int)lVar9);
    }
  }
  return;
}

Assistant:

void iCopyColors(BYTE *pout, const BYTE *pin, int count, int step, FCopyInfo *inf,
	BYTE tr, BYTE tg, BYTE tb)
{
	int i;
	int fac;
	BYTE r,g,b;
	int gray;
	int a;

	switch(inf? inf->blend : BLEND_NONE)
	{
	case BLEND_NONE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				TBlend::OpC(pout[TDest::RED], TSrc::R(pin), a, inf);
				TBlend::OpC(pout[TDest::GREEN], TSrc::G(pin), a, inf);
				TBlend::OpC(pout[TDest::BLUE], TSrc::B(pin), a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_ICEMAP:
		// Create the ice translation table, based on Hexen's.
		// Since this is done in True Color the purplish tint is fully preserved - even in Doom!
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				int gray = TSrc::Gray(pin)>>4;
	
				TBlend::OpC(pout[TDest::RED],   IcePalette[gray][0], a, inf);
				TBlend::OpC(pout[TDest::GREEN], IcePalette[gray][1], a, inf);
				TBlend::OpC(pout[TDest::BLUE],  IcePalette[gray][2], a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	default:

		if (inf->blend >= BLEND_SPECIALCOLORMAP1)
		{
			FSpecialColormap *cm = &SpecialColormaps[inf->blend - BLEND_SPECIALCOLORMAP1];
			for(i=0;i<count;i++)
			{
				a = TSrc::A(pin, tr, tg, tb);
				if (TBlend::ProcessAlpha0() || a)
				{
					gray = clamp<int>(TSrc::Gray(pin),0,255);

					PalEntry pe = cm->GrayscaleToColor[gray];
					TBlend::OpC(pout[TDest::RED], pe.r , a, inf);
					TBlend::OpC(pout[TDest::GREEN], pe.g, a, inf);
					TBlend::OpC(pout[TDest::BLUE], pe.b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		else if (inf->blend >= BLEND_DESATURATE1 && inf->blend<=BLEND_DESATURATE31)
		{
			// Desaturated light settings.
			fac=inf->blend-BLEND_DESATURATE1+1;
			for(i=0;i<count;i++)
			{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
				{
					gray = TSrc::Gray(pin);
					r = (TSrc::R(pin)*(31-fac) + gray*fac)/31;
					g = (TSrc::G(pin)*(31-fac) + gray*fac)/31;
					b = (TSrc::B(pin)*(31-fac) + gray*fac)/31;

					TBlend::OpC(pout[TDest::RED],   r, a, inf);
					TBlend::OpC(pout[TDest::GREEN], g, a, inf);
					TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		break;

	case BLEND_MODULATE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[0])>>BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[1])>>BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[2])>>BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_OVERLAY:
		for(i=0;i<count;i++)
		{
			// color blend
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[3] + inf->blendcolor[0]) >> BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[3] + inf->blendcolor[1]) >> BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[3] + inf->blendcolor[2]) >> BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	}
}